

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

bool libcellml::isErrorRelatedToComponent(IssuePtr *error,ComponentPtr *component)

{
  Issue *pIVar1;
  CellmlElementType CVar2;
  element_type *peVar3;
  element_type *peVar4;
  ComponentPtr parent;
  Issue local_68;
  Issue local_58;
  Issue local_48;
  AnyCellmlElement local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  Issue::item(&local_68);
  CVar2 = AnyCellmlElement::type((AnyCellmlElement *)local_68._vptr_Issue);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68.mPimpl);
  if (CVar2 == VARIABLE) {
    Issue::item(&local_48);
    AnyCellmlElement::variable(&local_38);
    local_58._vptr_Issue = (_func_int **)local_38.mPimpl;
    local_58.mPimpl = (IssueImpl *)a_Stack_30[0]._M_pi;
    local_38.mPimpl = (AnyCellmlElementImpl *)0x0;
    a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    owningComponent((ParentedEntityConstPtr *)&local_68);
  }
  else {
    if (CVar2 != RESET) {
      if (CVar2 != COMPONENT) {
        return false;
      }
      Issue::item(&local_58);
      AnyCellmlElement::component((AnyCellmlElement *)&local_68);
      peVar3 = (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_68.mPimpl);
      pIVar1 = &local_58;
      peVar4 = (element_type *)local_68._vptr_Issue;
      goto LAB_001ee564;
    }
    Issue::item(&local_48);
    AnyCellmlElement::reset(&local_38);
    local_58._vptr_Issue = (_func_int **)local_38.mPimpl;
    local_58.mPimpl = (IssueImpl *)a_Stack_30[0]._M_pi;
    local_38.mPimpl = (AnyCellmlElementImpl *)0x0;
    a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    owningComponent((ParentedEntityConstPtr *)&local_68);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.mPimpl);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48.mPimpl);
  peVar3 = (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pIVar1 = &local_68;
  peVar4 = (element_type *)local_68._vptr_Issue;
LAB_001ee564:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pIVar1->mPimpl);
  if (peVar3 != peVar4) {
    return false;
  }
  return true;
}

Assistant:

bool isErrorRelatedToComponent(const IssuePtr &error, const ComponentPtr &component)
{
    auto errorType = error->item()->type();
    if (errorType == CellmlElementType::COMPONENT) {
        if (component == error->item()->component()) {
            return true;
        }
    } else if (errorType == CellmlElementType::VARIABLE) {
        auto parent = owningComponent(error->item()->variable());
        if (component == parent) {
            return true;
        }
    } else if (errorType == CellmlElementType::RESET) {
        auto parent = owningComponent(error->item()->reset());
        if (component == parent) {
            return true;
        }
    }

    return false;
}